

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_init.c
# Opt level: O1

void inputMethodInstantiateCallback(Display *display,XPointer clientData,XPointer callData)

{
  char *pcVar1;
  ulong uVar2;
  _GLFWwindow *window;
  XIMCallback callback;
  ushort *local_18;
  code *local_10;
  
  if (_glfw.x11.im == (XIM)0x0) {
    _glfw.x11.im = (*_glfw.x11.xlib.OpenIM)
                             (_glfw.x11.display,(XrmDatabase *)0x0,(char *)0x0,(char *)0x0);
    if (_glfw.x11.im != (XIM)0x0) {
      local_18 = (ushort *)0x0;
      pcVar1 = (*_glfw.x11.xlib.GetIMValues)(_glfw.x11.im,"queryInputStyle",&local_18,0);
      if (pcVar1 == (char *)0x0) {
        if ((ulong)*local_18 != 0) {
          uVar2 = 0;
          do {
            if (*(long *)(*(long *)(local_18 + 4) + uVar2 * 8) == 0x408) {
              (*_glfw.x11.xlib.Free)(local_18);
              goto LAB_00187bce;
            }
            uVar2 = uVar2 + 1;
          } while (*local_18 != uVar2);
        }
        (*_glfw.x11.xlib.Free)(local_18);
      }
      (*_glfw.x11.xlib.CloseIM)(_glfw.x11.im);
      _glfw.x11.im = (XIM)0x0;
    }
LAB_00187bce:
    if (_glfw.x11.im != (XIM)0x0) {
      local_10 = inputMethodDestroyCallback;
      local_18 = (ushort *)0x0;
      (*_glfw.x11.xlib.SetIMValues)(_glfw.x11.im,"destroyCallback",&local_18,0);
      for (window = _glfw.windowListHead; window != (_GLFWwindow *)0x0; window = window->next) {
        _glfwCreateInputContextX11(window);
      }
    }
  }
  return;
}

Assistant:

static void inputMethodInstantiateCallback(Display* display,
                                           XPointer clientData,
                                           XPointer callData)
{
    if (_glfw.x11.im)
        return;

    _glfw.x11.im = XOpenIM(_glfw.x11.display, 0, NULL, NULL);
    if (_glfw.x11.im)
    {
        if (!hasUsableInputMethodStyle())
        {
            XCloseIM(_glfw.x11.im);
            _glfw.x11.im = NULL;
        }
    }

    if (_glfw.x11.im)
    {
        XIMCallback callback;
        callback.callback = (XIMProc) inputMethodDestroyCallback;
        callback.client_data = NULL;
        XSetIMValues(_glfw.x11.im, XNDestroyCallback, &callback, NULL);

        for (_GLFWwindow* window = _glfw.windowListHead;  window;  window = window->next)
            _glfwCreateInputContextX11(window);
    }
}